

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O2

void sf::priv::GlContext::releaseTransientContext(void)

{
  Lock *this;
  Context *this_00;
  int *piVar1;
  void *pvVar2;
  Lock lock;
  Lock LStack_18;
  
  Lock::Lock(&LStack_18,(Mutex *)&(anonymous_namespace)::GlContextImpl::mutex);
  piVar1 = (int *)ThreadLocal::getValue
                            ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::transientContext)
  ;
  *piVar1 = *piVar1 + -1;
  piVar1 = (int *)ThreadLocal::getValue
                            ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::transientContext)
  ;
  if (*piVar1 == 0) {
    pvVar2 = ThreadLocal::getValue
                       ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::transientContext);
    if (pvVar2 != (void *)0x0) {
      if (*(char *)((long)pvVar2 + 0x18) == '\x01') {
        setActive((anonymous_namespace)::GlContextImpl::sharedContext,false);
      }
      this = *(Lock **)((long)pvVar2 + 0x10);
      if (this != (Lock *)0x0) {
        Lock::~Lock(this);
      }
      operator_delete(this);
      this_00 = *(Context **)((long)pvVar2 + 8);
      if (this_00 != (Context *)0x0) {
        Context::~Context(this_00);
      }
      operator_delete(this_00);
    }
    operator_delete(pvVar2);
    ThreadLocal::setValue
              ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::transientContext,(void *)0x0);
  }
  Lock::~Lock(&LStack_18);
  return;
}

Assistant:

void GlContext::releaseTransientContext()
{
    using GlContextImpl::mutex;
    using GlContextImpl::transientContext;

    // Protect from concurrent access
    Lock lock(mutex);

    // Make sure a matching acquireTransientContext() was called
    assert(transientContext);

    // Decrease the reference count
    transientContext->referenceCount--;

    // If this is the last TransientContextLock that is released
    // destroy the state object
    if (transientContext->referenceCount == 0)
    {
        delete transientContext;
        transientContext = NULL;
    }
}